

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hmac.c
# Opt level: O0

void cf_hmac_init(cf_hmac_ctx *ctx,cf_chash *hash,uint8_t *key,size_t nkey)

{
  uint8_t local_128 [8];
  uint8_t blk [128];
  uint8_t k [128];
  size_t nkey_local;
  uint8_t *key_local;
  cf_chash *hash_local;
  cf_hmac_ctx *ctx_local;
  
  if (ctx == (cf_hmac_ctx *)0x0) {
    abort();
  }
  if (hash == (cf_chash *)0x0) {
    abort();
  }
  mem_clean(ctx,0x2d8);
  ctx->hash = hash;
  k._120_8_ = nkey;
  nkey_local = (size_t)key;
  if (hash->blocksz < nkey) {
    if (hash->blocksz < hash->hashsz) {
      abort();
    }
    cf_hash(hash,key,nkey,blk + 0x78);
    nkey_local = (size_t)(blk + 0x78);
    k._120_8_ = hash->hashsz;
  }
  if (blk + 0x78 != (uint8_t *)nkey_local) {
    memcpy(blk + 0x78,(void *)nkey_local,k._120_8_);
  }
  if ((ulong)k._120_8_ < hash->blocksz) {
    memset(blk + k._120_8_ + 0x78,0,hash->blocksz - k._120_8_);
  }
  xor_b8(local_128,blk + 0x78,'6',hash->blocksz);
  (*hash->init)(&ctx->inner);
  (*hash->update)(&ctx->inner,local_128,hash->blocksz);
  xor_b8(local_128,blk + 0x78,'\\',hash->blocksz);
  (*hash->init)(&ctx->outer);
  (*hash->update)(&ctx->outer,local_128,hash->blocksz);
  mem_clean(local_128,0x80);
  mem_clean(blk + 0x78,0x80);
  return;
}

Assistant:

void cf_hmac_init(cf_hmac_ctx *ctx,
                  const cf_chash *hash,
                  const uint8_t *key, size_t nkey)
{
  assert(ctx);
  assert(hash);

  mem_clean(ctx, sizeof *ctx);
  ctx->hash = hash;

  /* Prepare key: */
  uint8_t k[CF_CHASH_MAXBLK];

  /* Shorten long keys. */
  if (nkey > hash->blocksz)
  {
    /* Standard doesn't cover case where blocksz < hashsz.
     * FIPS186-1 seems to want to append a negative number of zero bytes.
     * In any case, we only have a k buffer of CF_CHASH_MAXBLK! */
    assert(hash->hashsz <= hash->blocksz);

    cf_hash(hash, key, nkey, k);
    key = k;
    nkey = hash->hashsz;
  }

  /* Right zero-pad short keys. */
  if (k != key)
    memcpy(k, key, nkey);
  if (hash->blocksz > nkey)
    memset(k + nkey, 0, hash->blocksz - nkey);

  /* Start inner hash computation */
  uint8_t blk[CF_CHASH_MAXBLK];

  xor_b8(blk, k, 0x36, hash->blocksz);
  hash->init(&ctx->inner);
  hash->update(&ctx->inner, blk, hash->blocksz);

  /* And outer. */
  xor_b8(blk, k, 0x5c, hash->blocksz);
  hash->init(&ctx->outer);
  hash->update(&ctx->outer, blk, hash->blocksz);

  mem_clean(blk, sizeof blk);
  mem_clean(k, sizeof k);
}